

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O0

int Rwr_ManNodeVolume(Rwr_Man_t *p,Rwr_Node_t *p0,Rwr_Node_t *p1)

{
  int local_24;
  Rwr_Node_t *pRStack_20;
  int Volume;
  Rwr_Node_t *p1_local;
  Rwr_Node_t *p0_local;
  Rwr_Man_t *p_local;
  
  local_24 = 0;
  pRStack_20 = p1;
  p1_local = p0;
  p0_local = (Rwr_Node_t *)p;
  Rwr_ManIncTravId(p);
  Rwr_Trav_rec((Rwr_Man_t *)p0_local,p1_local,&local_24);
  Rwr_Trav_rec((Rwr_Man_t *)p0_local,pRStack_20,&local_24);
  return local_24;
}

Assistant:

int Rwr_ManNodeVolume( Rwr_Man_t * p, Rwr_Node_t * p0, Rwr_Node_t * p1 )
{
    int Volume = 0;
    Rwr_ManIncTravId( p );
    Rwr_Trav_rec( p, p0, &Volume );
    Rwr_Trav_rec( p, p1, &Volume );
    return Volume;
}